

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBScene.h
# Opt level: O3

void __thiscall Assimp::COB::Node::~Node(Node *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  this->_vptr_Node = (_func_int **)&PTR__Node_008102b8;
  pcVar2 = (this->name)._M_dataplus._M_p;
  paVar1 = &(this->name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::_Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>::
  ~_Deque_base(&(this->temp_children).
                super__Deque_base<const_Assimp::COB::Node_*,_std::allocator<const_Assimp::COB::Node_*>_>
              );
  return;
}

Assistant:

virtual ~Node() {}